

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_isset_set(t_dart_generator *this,ostream *out,t_field *field)

{
  pointer pcVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  string field_name;
  char *local_68;
  char local_58 [8];
  undefined8 uStack_50;
  char *local_48;
  long local_40;
  char local_38 [8];
  undefined8 uStack_30;
  
  bVar4 = type_can_be_null(this,field->type_);
  if (!bVar4) {
    pcVar1 = (field->name_)._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (field->name_)._M_string_length);
    pcVar2 = local_48;
    iVar5 = tolower((int)*local_48);
    *pcVar2 = (char)iVar5;
    lVar3 = local_40;
    if (local_48 == local_38) {
      uStack_50 = uStack_30;
      local_68 = local_58;
    }
    else {
      local_68 = local_48;
    }
    local_40 = 0;
    local_38[0] = '\0';
    local_48 = local_38;
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"this.__isset_",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_68,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = true;",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
  }
  return;
}

Assistant:

void t_dart_generator::generate_isset_set(ostream& out, t_field* field) {
  if (!type_can_be_null(field->get_type())) {
    string field_name = get_member_name(field->get_name());
    indent(out) << "this.__isset_" << field_name << " = true;" << endl;
  }
}